

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_ForEachFunc(TA_CallForEachFunc functionToCall,void *opaqueData)

{
  uint uVar1;
  TA_FuncDef **ppTVar2;
  TA_FuncDef *pTVar3;
  uint local_40;
  uint funcDefTableSize;
  uint j;
  uint i;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_FuncDef **funcDefTable;
  void *opaqueData_local;
  TA_CallForEachFunc functionToCall_local;
  
  if (functionToCall == (TA_CallForEachFunc)0x0) {
    functionToCall_local._4_4_ = TA_BAD_PARAM;
  }
  else {
    for (funcDefTableSize = 0; funcDefTableSize < 0x1a; funcDefTableSize = funcDefTableSize + 1) {
      ppTVar2 = TA_DEF_Tables[funcDefTableSize];
      uVar1 = *TA_DEF_TablesSize[funcDefTableSize];
      for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
        pTVar3 = ppTVar2[local_40];
        if ((pTVar3 == (TA_FuncDef *)0x0) || (pTVar3->funcInfo == (TA_FuncInfo *)0x0)) {
          return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
        }
        if (pTVar3->funcInfo == (TA_FuncInfo *)0x0) {
          return TA_INTERNAL_ERROR|TA_GROUP_NOT_FOUND;
        }
        (*functionToCall)(pTVar3->funcInfo,opaqueData);
      }
    }
    functionToCall_local._4_4_ = TA_SUCCESS;
  }
  return functionToCall_local._4_4_;
}

Assistant:

TA_RetCode TA_ForEachFunc( TA_CallForEachFunc functionToCall, void *opaqueData )
{
   const TA_FuncDef **funcDefTable;
   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   unsigned int i, j, funcDefTableSize;

   if( functionToCall == NULL )
   {
      return TA_BAD_PARAM;
   }
   
   /* Iterate the tables (each table is for one letter) */
   for( i=0; i < 26; i++ )
   {   
      funcDefTable = TA_DEF_Tables[i];

      /* Identify the table size. */
      funcDefTableSize = *TA_DEF_TablesSize[i];
      for( j=0; j < funcDefTableSize; j++ )
      {
         funcDef = funcDefTable[j];
         if( !funcDef || !funcDef->funcInfo )
            return TA_INTERNAL_ERROR(3);

         funcInfo = funcDef->funcInfo;      
         if( !funcInfo )
            return TA_INTERNAL_ERROR(4);	
         (*functionToCall)( funcInfo, opaqueData );
      }
   }

   return TA_SUCCESS;
}